

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

GCObject ** sweeplist(lua_State *L,GCObject **p,lu_mem count)

{
  lu_int32 *plVar1;
  byte bVar2;
  int iVar3;
  global_State *pgVar4;
  GCObject *pGVar5;
  long lVar6;
  global_State *g;
  global_State *pgVar7;
  GCObject *L_00;
  GCObject **ppGVar8;
  size_t sVar9;
  
  L_00 = *p;
  if (L_00 != (GCObject *)0x0) {
    pgVar4 = L->l_G;
    bVar2 = pgVar4->currentwhite;
    lVar6 = count + 1;
    do {
      lVar6 = lVar6 + -1;
      if (lVar6 == 0) {
        return (GCObject **)(GCObject *)p;
      }
      if ((L_00->gch).tt == '\b') {
        sweeplist(L,&(L_00->th).openupval,0xfffffffffffffffd);
      }
      if ((byte)(((L_00->gch).marked ^ 3) & (bVar2 ^ 3)) != 0) {
        (L_00->gch).marked = pgVar4->currentwhite & 3 | (L_00->gch).marked & 0xf8;
        p = (GCObject **)L_00;
        goto switchD_00108bc9_default;
      }
      pGVar5 = (L_00->gch).next;
      ((GCheader *)p)->next = pGVar5;
      if (L_00 == pgVar4->rootgc) {
        pgVar4->rootgc = pGVar5;
      }
      switch((L_00->gch).tt) {
      case '\x04':
        pgVar7 = L->l_G;
        plVar1 = &(pgVar7->strt).nuse;
        *plVar1 = *plVar1 - 1;
        ppGVar8 = (GCObject **)((long)&((L_00->h).metatable)->array + 1);
        goto LAB_00108c4a;
      case '\x05':
        if ((L_00->h).node != &dummynode_) {
          sVar9 = 0x28L << ((L_00->h).lsizenode & 0x3f);
          pgVar7 = L->l_G;
          (*pgVar7->frealloc)(pgVar7->ud,(L_00->h).node,sVar9,0);
          pgVar7->totalbytes = pgVar7->totalbytes - sVar9;
        }
        iVar3 = (L_00->h).sizearray;
        pgVar7 = L->l_G;
        (*pgVar7->frealloc)(pgVar7->ud,(L_00->h).array,(long)iVar3 * 0x10,0);
        pgVar7->totalbytes = pgVar7->totalbytes + (long)iVar3 * -0x10;
        pgVar7 = L->l_G;
        (*pgVar7->frealloc)(pgVar7->ud,L_00,0x40,0);
        pgVar7->totalbytes = pgVar7->totalbytes - 0x40;
        break;
      case '\x06':
        pgVar7 = L->l_G;
        ppGVar8 = (GCObject **)
                  (ulong)(((uint)(L_00->h).lsizenode << (4U - ((L_00->h).flags == '\0') & 0x1f)) +
                          0x28 & 0xfff8);
        goto LAB_00108c4a;
      case '\a':
        ppGVar8 = &((L_00->th).l_G)->rootgc;
        pgVar7 = L->l_G;
LAB_00108c4a:
        (*pgVar7->frealloc)(pgVar7->ud,L_00,(size_t)ppGVar8,0);
        pgVar7->totalbytes = pgVar7->totalbytes - (long)ppGVar8;
        break;
      case '\b':
        luaF_close(&L_00->th,(L_00->th).stack);
        freestack(L,&L_00->th);
        pgVar7 = L->l_G;
        (*pgVar7->frealloc)(pgVar7->ud,L_00,0xb8,0);
        pgVar7->totalbytes = pgVar7->totalbytes - 0xb8;
        break;
      case '\t':
        iVar3 = (L_00->p).sizecode;
        pgVar7 = L->l_G;
        (*pgVar7->frealloc)(pgVar7->ud,(L_00->h).array,(long)iVar3 * 4,0);
        pgVar7->totalbytes = pgVar7->totalbytes + (long)iVar3 * -4;
        iVar3 = (L_00->p).sizep;
        pgVar7 = L->l_G;
        (*pgVar7->frealloc)(pgVar7->ud,(L_00->h).node,(long)iVar3 * 8,0);
        pgVar7->totalbytes = pgVar7->totalbytes + (long)iVar3 * -8;
        iVar3 = (L_00->p).sizek;
        pgVar7 = L->l_G;
        (*pgVar7->frealloc)(pgVar7->ud,(L_00->h).metatable,(long)iVar3 * 0x10,0);
        pgVar7->totalbytes = pgVar7->totalbytes + (long)iVar3 * -0x10;
        iVar3 = (L_00->p).sizelineinfo;
        pgVar7 = L->l_G;
        (*pgVar7->frealloc)(pgVar7->ud,(L_00->h).lastfree,(long)iVar3 * 4,0);
        pgVar7->totalbytes = pgVar7->totalbytes + (long)iVar3 * -4;
        iVar3 = (L_00->p).sizelocvars;
        pgVar7 = L->l_G;
        (*pgVar7->frealloc)(pgVar7->ud,(L_00->h).gclist,(long)iVar3 * 0x10,0);
        pgVar7->totalbytes = pgVar7->totalbytes + (long)iVar3 * -0x10;
        iVar3 = (L_00->p).sizeupvalues;
        pgVar7 = L->l_G;
        (*pgVar7->frealloc)(pgVar7->ud,(L_00->p).upvalues,(long)iVar3 * 8,0);
        pgVar7->totalbytes = pgVar7->totalbytes + (long)iVar3 * -8;
        pgVar7 = L->l_G;
        (*pgVar7->frealloc)(pgVar7->ud,L_00,0x78,0);
        pgVar7->totalbytes = pgVar7->totalbytes - 0x78;
        break;
      case '\n':
        luaF_freeupval(L,&L_00->uv);
      }
switchD_00108bc9_default:
      L_00 = ((GCheader *)p)->next;
    } while (L_00 != (GCObject *)0x0);
  }
  return (GCObject **)(GCObject *)p;
}

Assistant:

static GCObject**sweeplist(lua_State*L,GCObject**p,lu_mem count){
GCObject*curr;
global_State*g=G(L);
int deadmask=otherwhite(g);
while((curr=*p)!=NULL&&count-->0){
if(curr->gch.tt==8)
sweepwholelist(L,&gco2th(curr)->openupval);
if((curr->gch.marked^bit2mask(0,1))&deadmask){
makewhite(g,curr);
p=&curr->gch.next;
}
else{
*p=curr->gch.next;
if(curr==g->rootgc)
g->rootgc=curr->gch.next;
freeobj(L,curr);
}
}
return p;
}